

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

int enet_protocol_check_outgoing_commands(ENetHost *host,ENetPeer *peer)

{
  uint32_t *puVar1;
  short *psVar2;
  byte *pbVar3;
  ENetList *pEVar4;
  ENetList *pEVar5;
  ENetList *pEVar6;
  byte bVar7;
  ushort uVar8;
  short sVar9;
  short sVar10;
  uint32_t uVar11;
  size_t sVar12;
  _ENetListNode *p_Var13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  int iVar28;
  _ENetListNode *p_Var29;
  ulong uVar30;
  byte bVar31;
  long lVar32;
  ulong uVar33;
  uint uVar34;
  ENetListIterator result;
  _ENetListNode *p_Var35;
  _ENetListNode *p_Var36;
  long lVar37;
  ENetPacket *packet;
  long *plVar38;
  undefined4 *puVar39;
  uint uVar40;
  ENetChannel *pEVar41;
  int local_70;
  _ENetListNode *local_68;
  
  lVar32 = host->commandCount * 0x30 + 0x8c;
  lVar37 = host->bufferCount * 0x10 + 0x698;
  pEVar4 = &peer->outgoingCommands;
  pEVar5 = &peer->sentUnreliableCommands;
  pEVar6 = &peer->sentReliableCommands;
  pEVar41 = (ENetChannel *)0x0;
  uVar40 = 0;
  bVar27 = false;
  bVar25 = false;
  local_70 = 1;
  p_Var35 = (peer->outgoingCommands).sentinel.next;
LAB_001073f4:
  do {
    while( true ) {
      if (p_Var35 == &pEVar4->sentinel) goto LAB_00107857;
      bVar7 = *(byte *)&p_Var35[2].previous;
      bVar26 = true;
      if (-1 < (char)bVar7) break;
      uVar30 = (ulong)*(byte *)((long)&p_Var35[2].previous + 1);
      if (uVar30 < peer->channelCount) {
        uVar8 = *(ushort *)&p_Var35[1].next;
        uVar40 = (uint)(uVar8 >> 0xc);
        if (peer->channels == (ENetChannel *)0x0) goto LAB_001074b5;
        pEVar41 = peer->channels + uVar30;
        if ((!bVar25) &&
           (((uVar8 & 0xfff) != 0 || *(short *)((long)&p_Var35[2].next + 6) != 0 ||
            ((bVar25 = bVar26, pEVar41->reliableWindows[uVar40 - 1 & 0xf] < 0x1000 &&
             (bVar31 = (byte)(uVar8 >> 0xc),
             ((0x3ffU >> (0x10 - bVar31 & 0x1f) | 0x3ff << bVar31) &
             (uint)pEVar41->usedReliableWindows) == 0)))))) {
          bVar25 = false;
          goto LAB_001074b8;
        }
      }
      else {
        uVar40 = (uint)(*(ushort *)&p_Var35[1].next >> 0xc);
LAB_001074b5:
        pEVar41 = (ENetChannel *)0x0;
LAB_001074b8:
        if (p_Var35[5].previous == (_ENetListNode *)0x0) {
LAB_00107505:
          local_70 = 0;
          break;
        }
        if (!bVar27) {
          uVar34 = peer->windowSize * peer->packetThrottle >> 5;
          if (uVar34 <= peer->mtu) {
            uVar34 = peer->mtu;
          }
          bVar27 = bVar26;
          if ((uint)*(ushort *)((long)&p_Var35[2].next + 4) + peer->reliableDataInTransit <= uVar34)
          {
            bVar27 = false;
            goto LAB_00107505;
          }
        }
      }
      p_Var35 = p_Var35->next;
    }
    if (0xa97 < lVar37 || 0x68b < lVar32) {
LAB_0010784f:
      host->continueSending = 1;
LAB_00107857:
      host->commandCount = (lVar32 + -0x8c) / 0x30;
      host->bufferCount = lVar37 + -0x698 >> 4;
      if ((((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
           ((pEVar4->sentinel).next == &pEVar4->sentinel)) &&
          ((pEVar6->sentinel).next == &pEVar6->sentinel)) &&
         ((pEVar5->sentinel).next == &pEVar5->sentinel)) {
        enet_peer_disconnect(peer,peer->eventData);
      }
      return local_70;
    }
    uVar30 = commandSizes[bVar7 & 0xf];
    sVar12 = host->packetSize;
    uVar33 = peer->mtu - sVar12;
    if (uVar33 < uVar30) goto LAB_0010784f;
    packet = (ENetPacket *)p_Var35[5].previous;
    if (packet == (ENetPacket *)0x0) {
      plVar38 = (long *)((long)host->commands + lVar37 + -0x7c);
      local_68 = p_Var35->next;
      if ((char)bVar7 < '\0') {
LAB_0010771a:
        if ((pEVar41 != (ENetChannel *)0x0) && (*(short *)((long)&p_Var35[2].next + 6) == 0)) {
          pEVar41->usedReliableWindows = pEVar41->usedReliableWindows | (ushort)(1 << (sbyte)uVar40)
          ;
          pEVar41->reliableWindows[uVar40] = pEVar41->reliableWindows[uVar40] + 1;
        }
        psVar2 = (short *)((long)&p_Var35[2].next + 6);
        *psVar2 = *psVar2 + 1;
        iVar28 = *(int *)&p_Var35[1].previous;
        if (iVar28 == 0) {
          iVar28 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
          *(int *)&p_Var35[1].previous = iVar28;
          *(uint32_t *)((long)&p_Var35[1].previous + 4) = peer->timeoutLimit * iVar28;
        }
        uVar11 = host->serviceTime;
        if ((pEVar6->sentinel).next == &pEVar6->sentinel) {
          peer->nextTimeout = iVar28 + uVar11;
        }
        p_Var36 = p_Var35->previous;
        p_Var36->next = local_68;
        local_68->previous = p_Var36;
        p_Var36 = (peer->sentReliableCommands).sentinel.previous;
        p_Var35->previous = p_Var36;
        p_Var35->next = &pEVar6->sentinel;
        p_Var36->next = p_Var35;
        (peer->sentReliableCommands).sentinel.previous = p_Var35;
        *(uint32_t *)((long)&p_Var35[1].next + 4) = uVar11;
        pbVar3 = (byte *)((long)&host->headerFlags + 1);
        *pbVar3 = *pbVar3 | 0x40;
        peer->reliableDataInTransit =
             peer->reliableDataInTransit + (uint)*(ushort *)((long)&p_Var35[2].next + 4);
      }
      else {
        p_Var36 = p_Var35->previous;
        p_Var36->next = local_68;
        local_68->previous = p_Var36;
      }
      goto LAB_001077c7;
    }
    if (((uint)uVar33 & 0xffff) <
        (uint)(ushort)(*(short *)((long)&p_Var35[2].next + 4) + (short)uVar30)) goto LAB_0010784f;
    local_68 = p_Var35->next;
    if ((char)bVar7 < '\0') {
      plVar38 = (long *)((long)host->commands + lVar37 + -0x7c);
      goto LAB_0010771a;
    }
    if (((*(int *)&p_Var35[2].next != 0) || (((ulong)*(_ENetListNode **)&packet->flags & 0x20) != 0)
        ) || (uVar34 = peer->packetThrottleCounter + 7 & 0x1f, peer->packetThrottleCounter = uVar34,
             uVar34 <= peer->packetThrottle)) break;
    sVar9 = *(short *)&p_Var35[1].next;
    sVar10 = *(short *)((long)&p_Var35[1].next + 2);
    p_Var36 = p_Var35;
    while( true ) {
      p_Var35 = local_68;
      puVar1 = &packet->referenceCount;
      *puVar1 = *puVar1 - 1;
      p_Var29 = p_Var35;
      if (*puVar1 == 0) {
        enet_packet_destroy(packet);
        p_Var29 = p_Var36->next;
      }
      p_Var13 = p_Var36->previous;
      p_Var13->next = p_Var29;
      p_Var29->previous = p_Var13;
      (*(code *)callbacks_1)(p_Var36);
      if (((p_Var35 == &pEVar4->sentinel) || (*(short *)&p_Var35[1].next != sVar9)) ||
         (*(short *)((long)&p_Var35[1].next + 2) != sVar10)) break;
      packet = (ENetPacket *)p_Var35[5].previous;
      local_68 = p_Var35->next;
      p_Var36 = p_Var35;
    }
  } while( true );
  plVar38 = (long *)((long)host->commands + lVar37 + -0x7c);
  p_Var36 = p_Var35->previous;
  p_Var36->next = local_68;
  local_68->previous = p_Var36;
  p_Var36 = (peer->sentUnreliableCommands).sentinel.previous;
  p_Var35->previous = p_Var36;
  p_Var35->next = &pEVar5->sentinel;
  p_Var36->next = p_Var35;
  (peer->sentUnreliableCommands).sentinel.previous = p_Var35;
LAB_001077c7:
  puVar39 = (undefined4 *)((long)&host->socket + lVar32);
  *(undefined4 **)((long)&host->socket + lVar37) = puVar39;
  *(ulong *)((long)&(host->address).field_0 + lVar37 + 4) = uVar30;
  host->packetSize = sVar12 + uVar30;
  uVar14 = *(undefined4 *)&p_Var35[2].previous;
  uVar15 = *(undefined4 *)((long)&p_Var35[2].previous + 4);
  uVar16 = *(undefined4 *)&p_Var35[3].next;
  uVar17 = *(undefined4 *)((long)&p_Var35[3].next + 4);
  uVar18 = *(undefined4 *)&p_Var35[3].previous;
  uVar19 = *(undefined4 *)((long)&p_Var35[3].previous + 4);
  uVar20 = *(undefined4 *)&p_Var35[4].next;
  uVar21 = *(undefined4 *)((long)&p_Var35[4].next + 4);
  uVar22 = *(undefined4 *)((long)&p_Var35[4].previous + 4);
  uVar23 = *(undefined4 *)&p_Var35[5].next;
  uVar24 = *(undefined4 *)((long)&p_Var35[5].next + 4);
  puVar39[8] = *(undefined4 *)&p_Var35[4].previous;
  puVar39[9] = uVar22;
  puVar39[10] = uVar23;
  puVar39[0xb] = uVar24;
  puVar39[4] = uVar18;
  puVar39[5] = uVar19;
  puVar39[6] = uVar20;
  puVar39[7] = uVar21;
  *puVar39 = uVar14;
  puVar39[1] = uVar15;
  puVar39[2] = uVar16;
  puVar39[3] = uVar17;
  if (p_Var35[5].previous == (_ENetListNode *)0x0) {
    if (-1 < *(char *)&p_Var35[2].previous) {
      (*(code *)callbacks_1)(p_Var35);
    }
  }
  else {
    *plVar38 = (long)&(p_Var35[5].previous)->previous->next + (ulong)*(uint *)&p_Var35[2].next;
    uVar30 = (ulong)*(ushort *)((long)&p_Var35[2].next + 4);
    plVar38[1] = uVar30;
    host->packetSize = host->packetSize + uVar30;
    lVar37 = lVar37 + 0x10;
  }
  peer->totalPacketsSent = peer->totalPacketsSent + 1;
  lVar32 = lVar32 + 0x30;
  lVar37 = lVar37 + 0x10;
  p_Var35 = local_68;
  goto LAB_001073f4;
}

Assistant:

static int enet_protocol_check_outgoing_commands(ENetHost* host, ENetPeer* peer) {
	ENetProtocol* command = &host->commands[host->commandCount];
	ENetBuffer* buffer = &host->buffers[host->bufferCount];
	ENetOutgoingCommand* outgoingCommand;
	ENetListIterator currentCommand;
	ENetChannel* channel = NULL;
	uint16_t reliableWindow = 0;
	size_t commandSize = 0;
	int windowExceeded = 0, windowWrap = 0, canPing = 1;
	currentCommand = enet_list_begin(&peer->outgoingCommands);

	while (currentCommand != enet_list_end(&peer->outgoingCommands)) {
		outgoingCommand = (ENetOutgoingCommand*)currentCommand;

		if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
			channel = outgoingCommand->command.header.channelID < peer->channelCount ? &peer->channels[outgoingCommand->command.header.channelID] : NULL;
			reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

			if (channel != NULL) {
				if (!windowWrap && outgoingCommand->sendAttempts < 1 && !(outgoingCommand->reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) && (channel->reliableWindows[(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE || channel->usedReliableWindows & ((((1 << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) << reliableWindow) | (((1 << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow)))))
					windowWrap = 1;

				if (windowWrap) {
					currentCommand = enet_list_next(currentCommand);

					continue;
				}
			}

			if (outgoingCommand->packet != NULL) {
				if (!windowExceeded) {
					uint32_t windowSize = (peer->packetThrottle * peer->windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;

					if (peer->reliableDataInTransit + outgoingCommand->fragmentLength > ENET_MAX(windowSize, peer->mtu))
						windowExceeded = 1;
				}

				if (windowExceeded) {
					currentCommand = enet_list_next(currentCommand);

					continue;
				}
			}

			canPing = 0;
		}

		commandSize = commandSizes[outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK];

		if (command >= &host->commands[sizeof(host->commands) / sizeof(ENetProtocol)] || buffer + 1 >= &host->buffers[sizeof(host->buffers) / sizeof(ENetBuffer)] || peer->mtu - host->packetSize < commandSize || (outgoingCommand->packet != NULL && (uint16_t)(peer->mtu - host->packetSize) < (uint16_t)(commandSize + outgoingCommand->fragmentLength))) {
			host->continueSending = 1;

			break;
		}

		currentCommand = enet_list_next(currentCommand);

		if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
			if (channel != NULL && outgoingCommand->sendAttempts < 1) {
				channel->usedReliableWindows |= 1 << reliableWindow;
				++channel->reliableWindows[reliableWindow];
			}

			++outgoingCommand->sendAttempts;

			if (outgoingCommand->roundTripTimeout == 0) {
				outgoingCommand->roundTripTimeout = peer->roundTripTime + 4 * peer->roundTripTimeVariance;
				outgoingCommand->roundTripTimeoutLimit = peer->timeoutLimit * outgoingCommand->roundTripTimeout;
			}

			if (enet_list_empty(&peer->sentReliableCommands))
				peer->nextTimeout = host->serviceTime + outgoingCommand->roundTripTimeout;

			enet_list_insert(enet_list_end(&peer->sentReliableCommands),
				enet_list_remove(&outgoingCommand->outgoingCommandList));

			outgoingCommand->sentTime = host->serviceTime;
			host->headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;
			peer->reliableDataInTransit += outgoingCommand->fragmentLength;
		}
		else {
			if (outgoingCommand->packet != NULL && outgoingCommand->fragmentOffset == 0 && !(outgoingCommand->packet->flags & (ENET_PACKET_FLAG_UNTHROTTLED))) {
				peer->packetThrottleCounter += ENET_PEER_PACKET_THROTTLE_COUNTER;
				peer->packetThrottleCounter %= ENET_PEER_PACKET_THROTTLE_SCALE;

				if (peer->packetThrottleCounter > peer->packetThrottle) {
					uint16_t reliableSequenceNumber = outgoingCommand->reliableSequenceNumber,

						unreliableSequenceNumber = outgoingCommand->unreliableSequenceNumber;

					for (;;) {
						--outgoingCommand->packet->referenceCount;

						if (outgoingCommand->packet->referenceCount == 0)
							enet_packet_destroy(outgoingCommand->packet);

						enet_list_remove(&outgoingCommand->outgoingCommandList);
						enet_free(outgoingCommand);

						if (currentCommand == enet_list_end(&peer->outgoingCommands))
							break;

						outgoingCommand = (ENetOutgoingCommand*)currentCommand;

						if (outgoingCommand->reliableSequenceNumber != reliableSequenceNumber || outgoingCommand->unreliableSequenceNumber != unreliableSequenceNumber)
							break;

						currentCommand = enet_list_next(currentCommand);
					}

					continue;
				}
			}

			enet_list_remove(&outgoingCommand->outgoingCommandList);

			if (outgoingCommand->packet != NULL)
				enet_list_insert(enet_list_end(&peer->sentUnreliableCommands), outgoingCommand);
		}

		buffer->data = command;
		buffer->dataLength = commandSize;
		host->packetSize += buffer->dataLength;
		*command = outgoingCommand->command;

		if (outgoingCommand->packet != NULL) {
			++buffer;
			buffer->data = outgoingCommand->packet->data + outgoingCommand->fragmentOffset;
			buffer->dataLength = outgoingCommand->fragmentLength;
			host->packetSize += outgoingCommand->fragmentLength;
		}
		else if (!(outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)) {
			enet_free(outgoingCommand);
		}

		++peer->totalPacketsSent;
		++command;
		++buffer;
	}

	host->commandCount = command - host->commands;
	host->bufferCount = buffer - host->buffers;

	if (peer->state == ENET_PEER_STATE_DISCONNECT_LATER && enet_list_empty(&peer->outgoingCommands) && enet_list_empty(&peer->sentReliableCommands) && enet_list_empty(&peer->sentUnreliableCommands))
		enet_peer_disconnect(peer, peer->eventData);

	return canPing;
}